

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O2

void __thiscall
SparseArray_Fill_Test<unsigned_long>::~SparseArray_Fill_Test
          (SparseArray_Fill_Test<unsigned_long> *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST (SparseArray, Fill) {
    auto arr =
        sparse_array<std::string, TypeParam>::make_unique ({{0, "zero"}, {2, "two"}, {4, "four"}});
    arr->fill ("foo");

    std::vector<std::string> actual;
    std::copy (std::begin (*arr), std::end (*arr), std::back_inserter (actual));
    std::vector<std::string> const expected{"foo", "foo", "foo"};
    EXPECT_THAT (actual, ::testing::ContainerEq (expected));
}